

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O3

int Exa_ManAddCnf(Exa_Man_t *p,int iMint)

{
  long lVar1;
  int iVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  int (*paiVar12) [32];
  byte bVar13;
  bool bVar14;
  uint uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int pLits [3];
  int local_90;
  int local_8c;
  uint local_88 [6];
  int (*local_70) [2] [32];
  int (*local_68) [32];
  long local_60;
  long local_58;
  ulong local_50;
  uint local_44;
  int (*local_40) [2] [32];
  ulong local_38;
  
  auVar3 = _DAT_0094e250;
  uVar16 = p->pTruth[iMint >> 6];
  iVar7 = p->nVars;
  if (0 < (long)iVar7) {
    lVar8 = (long)iVar7 + -1;
    auVar17._8_4_ = (int)lVar8;
    auVar17._0_8_ = lVar8;
    auVar17._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar9 = 0;
    auVar17 = auVar17 ^ _DAT_0094e250;
    auVar18 = _DAT_0094e240;
    do {
      auVar19 = auVar18 ^ auVar3;
      if ((bool)(~(auVar19._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar19._0_4_ ||
                  auVar17._4_4_ < auVar19._4_4_) & 1)) {
        p->VarVals[uVar9] = (uint)(((uint)iMint >> ((uint)uVar9 & 0x1f) & 1) != 0);
      }
      if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
          auVar19._12_4_ <= auVar17._12_4_) {
        p->VarVals[uVar9 + 1] = (uint)(((uint)iMint >> ((uint)uVar9 + 1 & 0x1f) & 1) != 0);
      }
      uVar9 = uVar9 + 2;
      lVar8 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar8 + 2;
    } while ((iVar7 + 1U & 0xfffffffe) != uVar9);
  }
  bmcg_sat_solver_set_nvars(p->pSat,p->nNodes * 3 + p->iVar);
  local_90 = p->nVars;
  local_60 = (long)local_90;
  uVar9 = (ulong)(uint)p->nObjs;
  if (local_90 < p->nObjs) {
    local_40 = p->VarMarks;
    local_8c = local_90 * 6;
    local_90 = local_90 * 3;
    local_44 = (uint)((uVar16 >> ((ulong)(uint)iMint & 0x3f) & 1) != 0);
    do {
      local_38 = (ulong)(uint)p->nVars;
      local_58 = (long)p->iVar + (long)((int)local_60 - p->nVars) * 3;
      local_70 = local_40 + local_60;
      lVar8 = 0;
      bVar4 = true;
      do {
        bVar11 = bVar4;
        if (0 < (int)uVar9) {
          lVar1 = lVar8 + local_58;
          paiVar12 = *local_70 + lVar8;
          lVar8 = 0;
          local_68 = paiVar12;
          do {
            if ((*paiVar12)[lVar8] != 0) {
              uVar5 = ((int)lVar8 - p->nVars) * 3 + p->iVar;
              local_50 = (ulong)uVar5;
              uVar6 = 0;
              bVar4 = true;
              do {
                bVar14 = bVar4;
                if (((*paiVar12)[lVar8] < 0) ||
                   (local_88[0] = (*paiVar12)[lVar8] * 2 + 1, lVar1 < 0)) goto LAB_005aad8b;
                local_88[1] = uVar6 | (int)lVar1 * 2;
                if (lVar8 < p->nVars) {
                  iVar7 = 2;
                  if (p->VarVals[lVar8] != uVar6) goto LAB_005aabcd;
                }
                else {
                  if ((int)(uint)local_50 < -2) goto LAB_005aad8b;
                  local_88[2] = (uVar6 | uVar5 * 2 + 4) ^ 1;
                  iVar7 = 3;
LAB_005aabcd:
                  iVar7 = bmcg_sat_solver_addclause(p->pSat,(int *)local_88,iVar7);
                  if (iVar7 == 0) {
                    return 0;
                  }
                }
                uVar6 = 1;
                bVar4 = false;
              } while (bVar14);
              uVar9 = (ulong)(uint)p->nObjs;
              paiVar12 = local_68;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (int)uVar9);
        }
        lVar8 = 1;
        uVar5 = 0;
        bVar4 = false;
      } while (bVar11);
      iVar7 = (int)local_58;
      local_50 = CONCAT44(local_50._4_4_,iVar7 * 2);
      local_68 = (int (*) [32])CONCAT44(local_68._4_4_,iVar7 * 2 + 4);
      iVar2 = (int)local_38;
      local_70 = (int (*) [2] [32])(ulong)(uint)(local_8c + iVar2 * -6);
      bVar13 = 0;
      bVar4 = true;
      do {
        bVar11 = bVar4;
        if ((p->nObjs + -1 != (int)local_60) || (uVar5 != local_44)) {
          uVar6 = (int)local_70 + uVar5;
          uVar5 = uVar5 | (uint)local_68;
          uVar16 = 0;
          do {
            uVar15 = (uint)uVar16;
            if (!(bool)(bVar13 & uVar15 == 0)) {
              if ((int)local_58 < 0) {
LAB_005aad8b:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              local_88[0] = uVar15 & 1 | (uint)local_50;
              local_88[1] = (int)(uVar16 >> 1) + iVar7 * 2 + 2;
              lVar8 = 2;
              if (p->nObjs + -1 != (int)local_60) {
                lVar8 = 3;
                local_88[2] = uVar5 ^ 1;
              }
              iVar10 = (int)lVar8;
              if (uVar15 != 0) {
                if ((int)(local_90 + iVar2 * -3 + uVar15) < 0) goto LAB_005aad8b;
                iVar10 = iVar10 + 1;
                local_88[lVar8] = uVar6;
              }
              iVar10 = bmcg_sat_solver_addclause(p->pSat,(int *)local_88,iVar10);
              if (iVar10 == 0) {
                return 0;
              }
            }
            uVar16 = (ulong)(uVar15 + 1);
            uVar6 = uVar6 + 2;
          } while (uVar15 + 1 != 4);
        }
        uVar5 = 1;
        bVar13 = 1;
        bVar4 = false;
      } while (bVar11);
      local_60 = local_60 + 1;
      uVar9 = (ulong)p->nObjs;
      local_8c = local_8c + 6;
      local_90 = local_90 + 3;
    } while (local_60 < (long)uVar9);
  }
  p->iVar = p->iVar + p->nNodes * 3;
  return 1;
}

Assistant:

int Exa_ManAddCnf( Exa_Man_t * p, int iMint )
{
    // save minterm values
    int i, k, n, j, Value = Abc_TtGetBit(p->pTruth, iMint);
    for ( i = 0; i < p->nVars; i++ )
        p->VarVals[i] = (iMint >> i) & 1;
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar + 3*p->nNodes );
    //printf( "Adding clauses for minterm %d with value %d.\n", iMint, Value );
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        // fanin connectivity
        int iVarStart = 1 + 3*(i - p->nVars);
        int iBaseSatVarI = p->iVar + 3*(i - p->nVars);
        for ( k = 0; k < 2; k++ )
        {
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            {
                int iBaseSatVarJ = p->iVar + 3*(j - p->nVars);
                for ( n = 0; n < 2; n++ )
                {
                    int pLits[3], nLits = 0;
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                    pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + k, n );
                    if ( j >= p->nVars )
                        pLits[nLits++] = Abc_Var2Lit( iBaseSatVarJ + 2, !n );
                    else if ( p->VarVals[j] == n )
                        continue;
                    if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                        return 0;
                }
            }
        }
        // node functionality
        for ( n = 0; n < 2; n++ )
        {
            if ( i == p->nObjs - 1 && n == Value )
                continue;
            for ( k = 0; k < 4; k++ )
            {
                int pLits[4], nLits = 0;
                if ( k == 0 && n == 1 )
                    continue;
                pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 0, (k&1)  );
                pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 1, (k>>1) );
                if ( i != p->nObjs - 1 ) pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 2, !n );
                if ( k > 0 )             pLits[nLits++] = Abc_Var2Lit( iVarStart +  k-1,  n );
                assert( nLits <= 4 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                    return 0;
            }
        }
    }
    p->iVar += 3*p->nNodes;
    return 1;
}